

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolAccess.cpp
# Opt level: O2

int __thiscall
bhf::ads::SymbolAccess::Write<unsigned_char>(SymbolAccess *this,SymbolEntry *entry,string *v)

{
  long lVar1;
  code *pcVar2;
  ostream *poVar3;
  int iVar4;
  uint16_t integer_value;
  string local_358;
  uint8_t value;
  ostream local_328 [376];
  stringstream converter;
  long local_1a0 [2];
  byte abStack_190 [360];
  
  if (v->_M_string_length == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&converter);
    poVar3 = std::operator<<((ostream *)local_1a0,"Write");
    std::operator<<(poVar3,"<uint8_t>() empty strings are not supported\n");
    std::__cxx11::stringbuf::str();
    Logger::Log(3,(string *)&value);
    std::__cxx11::string::~string((string *)&value);
    std::__cxx11::stringstream::~stringstream((stringstream *)&converter);
    iVar4 = 0x706;
  }
  else {
    lVar1 = std::__cxx11::string::rfind((char *)v,0x136641);
    std::__cxx11::stringstream::stringstream((stringstream *)&converter);
    if (lVar1 == -1) {
      pcVar2 = std::dec;
    }
    else {
      pcVar2 = std::hex;
    }
    (*pcVar2)((ostream *)local_1a0 + *(long *)(local_1a0[0] + -0x18));
    std::operator<<((ostream *)local_1a0,(string *)v);
    std::istream::_M_extract<unsigned_short>((ushort *)&converter);
    if ((abStack_190[*(long *)(_converter + -0x18)] & 5) == 0) {
      value = '\0';
      lVar1 = AdsDevice::WriteReqEx
                        (&this->device,(entry->header).iGroup,(entry->header).iOffs,1,&value);
      iVar4 = (int)lVar1;
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)&value);
      poVar3 = std::operator<<(local_328,"Write");
      poVar3 = std::operator<<(poVar3,"() parsing \'");
      poVar3 = std::operator<<(poVar3,(string *)v);
      std::operator<<(poVar3,"\' failed\n");
      std::__cxx11::stringbuf::str();
      Logger::Log(3,&local_358);
      std::__cxx11::string::~string((string *)&local_358);
      std::__cxx11::stringstream::~stringstream((stringstream *)&value);
      iVar4 = 0x706;
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&converter);
  }
  return iVar4;
}

Assistant:

int SymbolAccess::Write<uint8_t>(const SymbolEntry& entry, const std::string& v) const
{
    if (!v.size()) {
        LOG_ERROR(__FUNCTION__ << "<uint8_t>() empty strings are not supported\n");
        return ADSERR_DEVICE_INVALIDDATA;
    }

    const auto asHex = (v.npos != v.rfind("0x", 0));
    std::stringstream converter;
    converter << (asHex ? std::hex : std::dec) << v;

    uint16_t integer_value = {};
    converter >> integer_value;
    if (converter.fail()) {
        LOG_ERROR(__FUNCTION__ << "() parsing '" << v << "' failed\n");
        return ADSERR_DEVICE_INVALIDDATA;
    }
    if (integer_value > std::numeric_limits<uint8_t>::max()) {
        LOG_ERROR(__FUNCTION__ << "() '" << v << "' does not fit into a single byte\n");
        return ADSERR_DEVICE_INVALIDDATA;
    }
    auto value = static_cast<uint8_t>(integer_value);
    return device.WriteReqEx(entry.header.iGroup,
                             entry.header.iOffs,
                             sizeof(value),
                             &value);
}